

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O2

node_pointer __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate_node(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                *this,undefined8 param_2,xml_node<char> *param_3)

{
  char *pcVar1;
  xml_attribute<char> *pxVar2;
  _func_int **pp_Var3;
  char *__nptr;
  _func_int *p_Var4;
  double dVar5;
  char *end;
  
  p_Var4 = (_func_int *)0x0;
  pxVar2 = rapidxml::xml_node<char>::first_attribute(param_3,"duration",0,true);
  if (pxVar2 != (xml_attribute<char> *)0x0) {
    pcVar1 = (pxVar2->super_xml_base<char>).m_value;
    __nptr = &rapidxml::xml_base<char>::nullstr()::zero;
    if (pcVar1 != (char *)0x0) {
      __nptr = pcVar1;
    }
    dVar5 = strtod(__nptr,&end);
    p_Var4 = (_func_int *)(long)(dVar5 * 1000000000.0);
  }
  pp_Var3 = (_func_int **)operator_new(0x28);
  pp_Var3[1] = (_func_int *)0x0;
  pp_Var3[2] = (_func_int *)0x0;
  pp_Var3[3] = (_func_int *)0x0;
  *pp_Var3 = (_func_int *)&PTR__abstract_node_00175338;
  pp_Var3[4] = p_Var4;
  (this->super_template_extend<true_node,_false_node>).super_generator_interface<_86869e04_>.
  super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
  ._vptr_generator_unit = pp_Var3;
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate_node(rapidxml::xml_node<>* data,
                             generate_node_type<decorator_timer_node<AgentProxy>>) const final {
    double dur = 0.0;

    auto attr = data->first_attribute("duration");
    if (attr) {
      char* end;
      dur = strtod(attr->value(), &end);
    }

    return node_pointer(new decorator_timer_node<AgentProxy>(std::chrono::duration<double>(dur)));
  }